

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RewindLoopSetWithFollowFirstCont::Exec
          (RewindLoopSetWithFollowFirstCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LoopSetWithFollowFirstInst *pLVar4;
  LoopInfo *a;
  undefined4 *puVar5;
  uint *puVar6;
  uint8 *puVar7;
  LoopInfo *loopInfo;
  LoopSetWithFollowFirstInst *begin;
  ContStack *contStack_local;
  uint8 **instPointer_local;
  CharCount *inputOffset_local;
  Char *input_local;
  Matcher *matcher_local;
  RewindLoopSetWithFollowFirstCont *this_local;
  
  Matcher::QueryContinue(matcher,qcTicks);
  pLVar4 = Matcher::LabelToInstPointer<UnifiedRegex::LoopSetWithFollowFirstInst>
                     (matcher,LoopSetWithFollowFirst,*(Label *)&(this->super_Cont).field_0xc);
  a = Matcher::LoopIdToLoopInfo
                (matcher,(pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.loopId);
  if (a->number <= (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x129d,"(loopInfo->number > begin->repeats.lower)",
                       "loopInfo->number > begin->repeats.lower");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (a->offsetsOfFollowFirst ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    if ((pLVar4->super_FollowFirstMixin).followFirst == L'\xffff') {
      a->number = a->number - 1;
    }
    else {
      a->number = (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower;
    }
  }
  else {
    bVar2 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                      (&a->offsetsOfFollowFirst->
                        super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
    if (bVar2) {
      a->number = (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower;
    }
    else {
      uVar3 = JsUtil::
              List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::RemoveAtEnd(a->offsetsOfFollowFirst);
      a->number = uVar3;
    }
  }
  puVar6 = max<unsigned_int>(&a->number,
                             &(pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower);
  a->number = *puVar6;
  *inputOffset = a->startInputOffset + a->number;
  if ((pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower < a->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopSetWithFollowFirstCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  puVar7 = Matcher::LabelToInstPointer(matcher,*(int *)&(this->super_Cont).field_0xc + 0x38);
  *instPointer = puVar7;
  return true;
}

Assistant:

inline bool RewindLoopSetWithFollowFirstCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        LoopSetWithFollowFirstInst* begin = matcher.L2I(LoopSetWithFollowFirst, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // loopInfo->number is the number of iterations completed before trying follow
        Assert(loopInfo->number > begin->repeats.lower);
        // Try follow with fewer iterations

        if (loopInfo->offsetsOfFollowFirst == nullptr)
        {
            if (begin->followFirst != MaxUChar)
            {
                // We determined the first character in the follow set at compile time,
                // but didn't find a single match for it in the last iteration of the loop.
                // So, there is no benefit in backtracking.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // We couldn't determine the first character in the follow set at compile time;
                // fall back to backtracking by one character at a time.
                loopInfo->number--;
            }
        }
        else
        {
            if (loopInfo->offsetsOfFollowFirst->Empty())
            {
                // We have already backtracked to the first offset where we matched the LoopSet's followFirst;
                // no point in backtracking more.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // Backtrack to the previous offset where we matched the LoopSet's followFirst
                // We will be doing one unnecessary match. But, if we wanted to avoid it, we'd have
                // to propagate to the next Inst, that the first character is already matched.
                // Seems like an overkill to avoid one match.
                loopInfo->number = loopInfo->offsetsOfFollowFirst->RemoveAtEnd();
            }
        }

        // If loopInfo->number now is less than begins->repeats.lower, the loop
        // shouldn't match anything. In that case, stop backtracking.
        loopInfo->number = max(loopInfo->number, begin->repeats.lower);
        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopSetWithFollowFirstCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(LoopSetWithFollowFirstInst));
        return true; // STOP BACKTRACKING
    }